

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

string * GetPragmaForContext_abi_cxx11_(TemplateContext context)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  TemplateContext context_local;
  
  pcVar5 = kPragmaXml;
  pcVar4 = kPragmaJson;
  pcVar3 = kPragmaCss;
  pcVar2 = kPragmaJs;
  pcVar1 = kPragmaHtml;
  this = (string *)CONCAT44(in_register_0000003c,context);
  psStack_10 = this;
  switch(in_ESI) {
  case 0:
    printf("ASSERT FAILED, line %d: %s\n",0xd4,"false");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0xd4,"string GetPragmaForContext(TemplateContext)");
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,pcVar1,local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,pcVar2,local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,pcVar3,&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,pcVar4,&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,pcVar5,&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  default:
    printf("ASSERT FAILED, line %d: %s\n",0xd6,"false");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0xd6,"string GetPragmaForContext(TemplateContext)");
  }
  return this;
}

Assistant:

static string GetPragmaForContext(TemplateContext context) {
  switch(context) {
    case TC_HTML:
      return kPragmaHtml;
    case TC_JS:
      return kPragmaJs;
    case TC_CSS:
      return kPragmaCss;
    case TC_JSON:
      return kPragmaJson;
    case TC_XML:
      return kPragmaXml;
    case TC_MANUAL:
      return "";  // No AUTOESCAPE pragma.
    case TC_UNUSED:
      ASSERT(false);  // Developer error, this TC is not to be used.
  }
  ASSERT(false);  // Developer error - invalid TemplateContext.
  return "";
}